

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_store.c
# Opt level: O0

file_ctx_st * file_open_stream(BIO *source,char *uri,void *provctx)

{
  char *in_RDX;
  undefined8 in_RSI;
  BIO *in_RDI;
  file_ctx_st *ctx;
  void *in_stack_ffffffffffffffd8;
  int type;
  file_ctx_st *local_8;
  
  type = (int)((ulong)in_RSI >> 0x20);
  local_8 = new_file_ctx(type,in_RDX,in_stack_ffffffffffffffd8);
  if (local_8 == (file_ctx_st *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,type,in_RDX);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
    free_file_ctx((file_ctx_st *)0x34c7a3);
    local_8 = (file_ctx_st *)0x0;
  }
  else {
    (local_8->_).file.file = in_RDI;
  }
  return local_8;
}

Assistant:

static struct file_ctx_st *file_open_stream(BIO *source, const char *uri,
                                            void *provctx)
{
    struct file_ctx_st *ctx;

    if ((ctx = new_file_ctx(IS_FILE, uri, provctx)) == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    ctx->_.file.file = source;

    return ctx;
 err:
    free_file_ctx(ctx);
    return NULL;
}